

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParserOpenSim.cpp
# Opt level: O3

void __thiscall
chrono::utils::ChParserOpenSim::SetCollisionFamilies
          (ChParserOpenSim *this,int family_1,int family_2)

{
  if (family_1 == family_2) {
    __assert_fail("family_1 != family_2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/utils/ChParserOpenSim.cpp"
                  ,0x52,"void chrono::utils::ChParserOpenSim::SetCollisionFamilies(int, int)");
  }
  if ((uint)family_1 < 0x10) {
    if ((uint)family_2 < 0x10) {
      this->m_family_1 = family_1;
      this->m_family_2 = family_2;
      this->m_collide = true;
      return;
    }
    __assert_fail("family_2 >= 0 && family_2 <= 15",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/utils/ChParserOpenSim.cpp"
                  ,0x54,"void chrono::utils::ChParserOpenSim::SetCollisionFamilies(int, int)");
  }
  __assert_fail("family_1 >= 0 && family_1 <= 15",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/utils/ChParserOpenSim.cpp"
                ,0x53,"void chrono::utils::ChParserOpenSim::SetCollisionFamilies(int, int)");
}

Assistant:

void ChParserOpenSim::SetCollisionFamilies(int family_1, int family_2) {
    assert(family_1 != family_2);
    assert(family_1 >= 0 && family_1 <= 15);
    assert(family_2 >= 0 && family_2 <= 15);

    m_family_1 = family_1;
    m_family_2 = family_2;
    m_collide = true;
}